

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateServiceOptions
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  long lVar1;
  FileOptions *pFVar2;
  string *element_name;
  int iVar3;
  FileOptions *pFVar4;
  LogMessage *other;
  int iVar5;
  LogFinisher local_69;
  undefined1 local_68 [56];
  
  lVar1 = *(long *)(service + 0x10);
  if (lVar1 != 0) {
    pFVar2 = *(FileOptions **)(lVar1 + 0x88);
    pFVar4 = FileOptions::default_instance();
    if (((pFVar2 != pFVar4) && (*(int *)(*(long *)(lVar1 + 0x88) + 0x50) == 3)) &&
       ((*(char *)(*(long *)(*(long *)(service + 0x10) + 0x88) + 0x56) != '\0' ||
        (*(char *)(*(long *)(*(long *)(service + 0x10) + 0x88) + 0x57) == '\x01')))) {
      element_name = *(string **)(service + 8);
      local_68._0_8_ = local_68 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,
                 "Files with optimize_for = LITE_RUNTIME cannot define services unless you set both options cc_generic_services and java_generic_sevices to false."
                 ,"");
      AddError(this,element_name,&proto->super_Message,NAME,(string *)local_68);
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
    }
  }
  iVar3 = *(int *)(service + 0x20);
  if (0 < iVar3) {
    iVar5 = 0;
    do {
      if ((proto->method_).super_RepeatedPtrFieldBase.current_size_ <= iVar5) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_68);
        iVar3 = *(int *)(service + 0x20);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar3);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateServiceOptions(ServiceDescriptor* service,
    const ServiceDescriptorProto& proto) {
  if (IsLite(service->file()) &&
      (service->file()->options().cc_generic_services() ||
       service->file()->options().java_generic_services())) {
    AddError(service->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services "
             "unless you set both options cc_generic_services and "
             "java_generic_sevices to false.");
  }

  VALIDATE_OPTIONS_FROM_ARRAY(service, method, Method);
}